

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  FT_CharMap pFVar1;
  FT_Error FVar2;
  FT_CharMap oldmap;
  FT_Face face_local;
  AF_CJKMetrics metrics_local;
  
  pFVar1 = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar2 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar2 == 0) {
    af_cjk_metrics_init_widths(metrics,face);
    af_cjk_metrics_init_blues(metrics,face);
    af_cjk_metrics_check_digits(metrics,face);
  }
  face->charmap = pFVar1;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    face->charmap = oldmap;
    return FT_Err_Ok;
  }